

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

namespace_t __thiscall cs::instance_type::import(instance_type *this,string *path,string *name)

{
  string *cxt;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  size_type sVar3;
  pointer pcVar4;
  slot_type *psVar5;
  compiler_type *this_00;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  instance_type *this_01;
  size_t __n;
  int iVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long *plVar9;
  size_t sVar10;
  fatal_error *this_02;
  runtime_error *prVar11;
  ulong *in_RCX;
  size_type *psVar12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pointer pbVar13;
  size_type sVar14;
  instance_type *args_1;
  namespace_t nVar15;
  string package_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  context_t rt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  collection;
  string tmp;
  key_arg<std::__cxx11::basic_string<char>_> local_2b8;
  string local_298;
  string *local_278;
  long *local_270;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_268;
  instance_type *local_260;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  pointer local_240;
  undefined1 local_238 [16];
  name_space local_228 [21];
  
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238._0_8_ = local_228;
  local_238._8_8_ = (slot_type *)0x0;
  local_228[0]._vptr_name_space._0_1_ = '\0';
  sVar3 = name->_M_string_length;
  local_278 = path;
  local_260 = this;
  if (sVar3 != 0) {
    pcVar4 = (name->_M_dataplus)._M_p;
    sVar14 = 0;
    do {
      if (pcVar4[sVar14] == ':') {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_258,(value_type *)local_238);
        local_238._8_8_ = (slot_type *)0x0;
        *(char *)local_238._0_8_ = '\0';
      }
      else {
        std::__cxx11::string::push_back((char)(value_type *)local_238);
      }
      sVar14 = sVar14 + 1;
    } while (sVar3 != sVar14);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_258,(value_type *)local_238);
  if ((name_space *)local_238._0_8_ != local_228) {
    operator_delete((void *)local_238._0_8_,
                    CONCAT71(local_228[0]._vptr_name_space._1_7_,local_228[0]._vptr_name_space._0_1_
                            ) + 1);
  }
  local_240 = local_258.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_298.field_2;
    pbVar13 = local_258.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_238._0_8_ = local_228;
      pcVar4 = (pbVar13->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_238,pcVar4,pcVar4 + pbVar13->_M_string_length);
      std::__cxx11::string::_M_replace_aux((ulong)local_238,local_238._8_8_,0,'\x01');
      plVar9 = (long *)std::__cxx11::string::_M_append((char *)local_238,*in_RCX);
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_2b8.field_2._M_allocated_capacity = *psVar12;
        local_2b8.field_2._8_8_ = plVar9[3];
      }
      else {
        local_2b8.field_2._M_allocated_capacity = *psVar12;
        local_2b8._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_2b8._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if ((name_space *)local_238._0_8_ != local_228) {
        operator_delete((void *)local_238._0_8_,
                        CONCAT71(local_228[0]._vptr_name_space._1_7_,
                                 local_228[0]._vptr_name_space._0_1_) + 1);
      }
      sVar10 = phmap::priv::
               raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
               ::count<std::__cxx11::string>
                         ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
                           *)(*(long *)local_278[9]._M_dataplus._M_p + 0x48),&local_2b8);
      if (sVar10 != 0) {
        phmap::priv::
        raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
        ::try_emplace_impl<std::__cxx11::string_const&>
                  ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>::iterator,_bool>
                    *)local_238,(void *)(*(long *)local_278[9]._M_dataplus._M_p + 0x48),&local_2b8);
        (local_260->super_runtime_type).literals.
        super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
        .
        super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
        .ctrl_ = (ctrl_t *)
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_238._8_8_ + 0x20))->
                 _vptr__Sp_counted_base;
        psVar5 = *(slot_type **)(local_238._8_8_ + 0x28);
        (local_260->super_runtime_type).literals.
        super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
        .
        super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
        .slots_ = psVar5;
        args_1 = local_260;
        if (psVar5 != (slot_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar12 = &(psVar5->value).first._M_string_length;
            *(int *)psVar12 = (int)*psVar12 + 1;
            UNLOCK();
          }
          else {
            psVar12 = &(psVar5->value).first._M_string_length;
            *(int *)psVar12 = (int)*psVar12 + 1;
          }
        }
LAB_00154a6b:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_258);
        nVar15.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             extraout_RDX._M_pi;
        nVar15.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)args_1;
        return (namespace_t)nVar15.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>;
      }
      local_298._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,local_2b8._M_dataplus._M_p,
                 local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
      std::__cxx11::string::append((char *)&local_298);
      std::ifstream::ifstream((string *)local_238,(string *)&local_298,_S_in);
      uVar2 = *(uint *)(&local_228[0].is_ref +
                       (long)((name_space *)(local_238._0_8_ + -0x18))->_vptr_name_space);
      std::ifstream::~ifstream((string *)local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != paVar1) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((uVar2 & 5) == 0) {
        cxt = local_278 + 9;
        create_subcontext((cs *)&local_270,(context_t *)cxt);
        this_00 = (compiler_type *)*local_270;
        local_238._0_8_ = local_228;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_238,local_2b8._M_dataplus._M_p,
                   local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
        std::__cxx11::string::append(local_238);
        local_298._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_2b8._M_dataplus._M_p,
                   local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
        std::__cxx11::string::append((char *)&local_298);
        compiler_type::import_csym(this_00,(string *)local_238,&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != paVar1) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        args_1 = local_260;
        if ((name_space *)local_238._0_8_ != local_228) {
          operator_delete((void *)local_238._0_8_,
                          CONCAT71(local_228[0]._vptr_name_space._1_7_,
                                   local_228[0]._vptr_name_space._0_1_) + 1);
        }
        lVar6 = *local_270;
        if (local_268 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_268->_M_use_count = local_268->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_268->_M_use_count = local_268->_M_use_count + 1;
          }
        }
        *(long **)(lVar6 + 0x20) = local_270;
        p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar6 + 0x28);
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar6 + 0x28) = local_268;
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
        }
        this_01 = (instance_type *)local_270[2];
        local_238._0_8_ = local_228;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_238,local_2b8._M_dataplus._M_p,
                   local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
        std::__cxx11::string::append(local_238);
        compile(this_01,(string *)local_238);
        if ((name_space *)local_238._0_8_ != local_228) {
          operator_delete((void *)local_238._0_8_,
                          CONCAT71(local_228[0]._vptr_name_space._1_7_,
                                   local_228[0]._vptr_name_space._0_1_) + 1);
        }
        plVar9 = (long *)local_278[9]._M_dataplus._M_p;
        sVar3 = local_278[9]._M_string_length;
        lVar6 = *plVar9;
        if (sVar3 != 0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(sVar3 + 8) = *(int *)(sVar3 + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(sVar3 + 8) = *(int *)(sVar3 + 8) + 1;
          }
        }
        *(long **)(lVar6 + 0x20) = plVar9;
        p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar6 + 0x28);
        *(size_type *)(lVar6 + 0x28) = sVar3;
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
        }
        interpret((instance_type *)local_270[2]);
        __n = local_270[0x13];
        if (__n == 0) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x28);
          local_238._0_8_ = local_228;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_238,"Target file is not a package.","");
          runtime_error::runtime_error(prVar11,(string *)local_238);
          __cxa_throw(prVar11,&runtime_error::typeinfo,runtime_error::~runtime_error);
        }
        if ((__n != in_RCX[1]) ||
           (iVar8 = bcmp((void *)local_270[0x12],(void *)*in_RCX,__n), iVar8 != 0)) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x28);
          local_238._0_8_ = local_228;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_238,"Package name is different from file name.","");
          runtime_error::runtime_error(prVar11,(string *)local_238);
          __cxa_throw(prVar11,&runtime_error::typeinfo,runtime_error::~runtime_error);
        }
        domain_manager::get_namespace((domain_manager *)local_238);
        (args_1->super_runtime_type).literals.
        super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
        .
        super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
        .ctrl_ = (ctrl_t *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<cs::name_space,std::allocator<cs::name_space>,cs::name_space&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &(args_1->super_runtime_type).literals.
                    super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
                    .
                    super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
                    .slots_,(name_space **)args_1,(allocator<cs::name_space> *)&local_298,
                   (name_space *)local_238._0_8_);
        if ((slot_type *)local_238._8_8_ != (slot_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
        }
        phmap::priv::
        raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
        ::
        emplace<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::shared_ptr<cs::name_space>_&,_0>
                  ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>::iterator,_bool>
                    *)local_238,
                   (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                    *)&((((__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> *)
                         &cxt->_M_dataplus)->_M_ptr->compiler).
                        super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       modules,&local_2b8,(shared_ptr<cs::name_space> *)args_1);
        if (local_268 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_268);
        }
        goto LAB_00154a6b;
      }
      local_298._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,local_2b8._M_dataplus._M_p,
                 local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
      std::__cxx11::string::append((char *)&local_298);
      std::ifstream::ifstream((string *)local_238,(string *)&local_298,_S_in);
      uVar2 = *(uint *)(&local_228[0].is_ref +
                       (long)((name_space *)(local_238._0_8_ + -0x18))->_vptr_name_space);
      std::ifstream::~ifstream((string *)local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != paVar1) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((uVar2 & 5) == 0) {
        local_238._0_8_ = local_228;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_238,local_2b8._M_dataplus._M_p,
                   local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
        std::__cxx11::string::append(local_238);
        args_1 = local_260;
        local_298._M_dataplus._M_p = (ctrl_t *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<cs::extension,std::allocator<cs::extension>,std::__cxx11::string>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_298._M_string_length,
                   (extension **)&local_298,(allocator<cs::extension> *)&local_270,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
        sVar3 = local_298._M_string_length;
        (args_1->super_runtime_type).literals.
        super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
        .
        super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
        .slots_ = (slot_type *)0x0;
        local_298._M_string_length = 0;
        (args_1->super_runtime_type).literals.
        super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
        .
        super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
        .ctrl_ = local_298._M_dataplus._M_p;
        (args_1->super_runtime_type).literals.
        super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
        .
        super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
        .slots_ = (slot_type *)sVar3;
        local_298._M_dataplus._M_p = (pointer)0x0;
        if ((name_space *)local_238._0_8_ != local_228) {
          operator_delete((void *)local_238._0_8_,
                          CONCAT71(local_228[0]._vptr_name_space._1_7_,
                                   local_228[0]._vptr_name_space._0_1_) + 1);
        }
        phmap::priv::
        raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
        ::
        emplace<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::shared_ptr<cs::name_space>_&,_0>
                  ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>::iterator,_bool>
                    *)local_238,
                   (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                    *)(*(long *)local_278[9]._M_dataplus._M_p + 0x48),&local_2b8,
                   (shared_ptr<cs::name_space> *)args_1);
        goto LAB_00154a6b;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      pbVar13 = pbVar13 + 1;
    } while (pbVar13 != local_240);
  }
  this_02 = (fatal_error *)__cxa_allocate_exception(0x28);
  local_238._0_8_ = local_228;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_238,"No such file or directory.","");
  fatal_error::fatal_error(this_02,(string *)local_238);
  __cxa_throw(this_02,&fatal_error::typeinfo,fatal_error::~fatal_error);
}

Assistant:

namespace_t instance_type::import(const std::string &path, const std::string &name)
	{
		std::vector<std::string> collection;
		{
			std::string tmp;
			for (auto &ch: path) {
				if (ch == cs::path_delimiter) {
					collection.push_back(tmp);
					tmp.clear();
				}
				else
					tmp.push_back(ch);
			}
			collection.push_back(tmp);
		}
		for (auto &it: collection) {
			std::string package_path = it + path_separator + name;
			if (context->compiler->modules.count(package_path) > 0)
				return context->compiler->modules[package_path];
			if (std::ifstream(package_path + ".csp")) {
				context_t rt = create_subcontext(context);
				rt->compiler->import_csym(package_path + ".csp", package_path + ".csym");
				rt->compiler->swap_context(rt);
				try {
					rt->instance->compile(package_path + ".csp");
				}
				catch (...) {
					context->compiler->swap_context(context);
					throw;
				}
				context->compiler->swap_context(context);
				rt->instance->interpret();
				if (rt->package_name.empty())
					throw runtime_error("Target file is not a package.");
				if (rt->package_name != name)
					throw runtime_error("Package name is different from file name.");
				namespace_t module = std::make_shared<name_space>(*rt->instance->storage.get_namespace());
				context->compiler->modules.emplace(package_path, module);
				return module;
			}
			else if (std::ifstream(package_path + ".cse")) {
				namespace_t module = std::make_shared<extension>(package_path + ".cse");
				context->compiler->modules.emplace(package_path, module);
				return module;
			}
		}
		throw fatal_error("No such file or directory.");
	}